

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O1

double __thiscall Preceptron_SIGMOID::Forward(Preceptron_SIGMOID *this)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  
  (this->super_Preceptron).output = 0.0;
  pdVar1 = (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    dVar5 = (this->super_Preceptron).output;
    pdVar2 = (this->super_Preceptron).input.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      dVar6 = pdVar1[lVar4] * pdVar2[lVar4];
      if ((this->super_Preceptron).useBias != false) {
        dVar6 = dVar6 + (this->super_Preceptron).bias;
      }
      dVar5 = dVar5 + dVar6;
      (this->super_Preceptron).output = dVar5;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  (*(this->super_Preceptron)._vptr_Preceptron[1])((this->super_Preceptron).output,this);
  (this->super_Preceptron).output = extraout_XMM0_Qa;
  return extraout_XMM0_Qa;
}

Assistant:

double Forward() {
		output = 0.0;
		for (int i = 0; i < weight.size(); i++) {
			output += useBias ? (weight[i] * input[i] + bias) : (weight[i] * input[i]);
		}
		output = Activiation(output);
		return output;
	}